

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

void Abc_NtkPrintFinResults(Vec_Wec_t *vClasses)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = vClasses->nSize;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      pVVar1 = vClasses->pArray;
      if (1 < pVVar1[lVar4].nSize) {
        lVar3 = 1;
        do {
          printf("%d %d\n",(ulong)(uint)*pVVar1[lVar4].pArray,
                 (ulong)(uint)pVVar1[lVar4].pArray[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < pVVar1[lVar4].nSize);
        iVar2 = vClasses->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

void Abc_NtkPrintFinResults( Vec_Wec_t * vClasses )
{
    Vec_Int_t * vClass;
    int i, k, Entry;
    Vec_WecForEachLevel( vClasses, vClass, i )
        Vec_IntForEachEntryStart( vClass, Entry, k, 1 )
            printf( "%d %d\n", Vec_IntEntry(vClass, 0), Entry );
}